

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

JavascriptString * __thiscall Js::ScriptFunction::GetDisplayNameImpl(ScriptFunction *this)

{
  code *pcVar1;
  charcount_t sz;
  char16 *name_00;
  char16 *computedNameVar_00;
  bool bVar2;
  int iVar3;
  FunctionProxy *pFVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  ScriptContext *pSVar6;
  ScriptConfiguration *this_00;
  undefined4 extraout_var_00;
  charcount_t local_54;
  char16 *pcStack_50;
  charcount_t symbolNameLength;
  char16 *symbolName;
  Var computedNameVar;
  JavascriptString *computedName;
  JavascriptString *returnStr;
  char16 *pcStack_28;
  charcount_t length;
  char16 *name;
  ParseableFunctionInfo *func;
  ScriptFunction *this_local;
  
  func = (ParseableFunctionInfo *)this;
  pFVar4 = GetFunctionProxy(this);
  if (pFVar4 == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x324,"(this->GetFunctionProxy() != nullptr)",
                                "this->GetFunctionProxy() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar4 = GetFunctionProxy(this);
  name = (char16 *)FunctionProxy::EnsureDeserialized(pFVar4);
  pcStack_28 = (char16 *)0x0;
  returnStr._4_4_ = 0;
  computedName = (JavascriptString *)0x0;
  EnterPinnedScope(&computedNameVar);
  iVar3 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x76])();
  symbolName = (char16 *)CONCAT44(extraout_var,iVar3);
  if (symbolName == (char16 *)0x0) {
    pcStack_28 = L"";
    bVar2 = ParseableFunctionInfo::GetIsNamedFunctionExpression((ParseableFunctionInfo *)name);
    if (bVar2) {
      pcStack_28 = FunctionProxy::GetShortDisplayName
                             ((FunctionProxy *)name,(charcount_t *)((long)&returnStr + 4));
    }
    else {
      bVar2 = ParseableFunctionInfo::GetIsNameIdentifierRef((ParseableFunctionInfo *)name);
      if (bVar2) {
        pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        this_00 = ScriptContext::GetConfig(pSVar6);
        bVar2 = ScriptConfiguration::IsES6FunctionNameFullEnabled(this_00);
        if (bVar2) {
          pcStack_28 = FunctionProxy::GetShortDisplayName
                                 ((FunctionProxy *)name,(charcount_t *)((long)&returnStr + 4));
        }
        else {
          bVar2 = ParseableFunctionInfo::GetIsDeclaration((ParseableFunctionInfo *)name);
          if ((((bVar2) ||
               (bVar2 = ParseableFunctionInfo::GetIsAccessor((ParseableFunctionInfo *)name), bVar2))
              || (bVar2 = FunctionProxy::IsLambda((FunctionProxy *)name), bVar2)) ||
             (iVar3 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.
                        super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(),
             CONCAT44(extraout_var_00,iVar3) != 0)) {
            pcStack_28 = FunctionProxy::GetShortDisplayName
                                   ((FunctionProxy *)name,(charcount_t *)((long)&returnStr + 4));
          }
        }
      }
    }
  }
  else {
    pcStack_50 = (char16 *)0x0;
    local_54 = 0;
    bVar2 = GetSymbolName(symbolName,&stack0xffffffffffffffb0,&local_54);
    computedNameVar_00 = symbolName;
    name_00 = pcStack_50;
    sz = local_54;
    if (bVar2) {
      if (local_54 == 0) {
        pcStack_28 = pcStack_50;
      }
      else {
        pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        pcStack_28 = FunctionProxy::WrapWithBrackets(name_00,sz,pSVar6);
        returnStr._4_4_ = local_54 + 2;
      }
    }
    else {
      pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      computedNameVar = GetComputedName(computedNameVar_00,pSVar6);
      bVar2 = ParseableFunctionInfo::GetIsAccessor((ParseableFunctionInfo *)name);
      if (!bVar2) {
        return (JavascriptString *)computedNameVar;
      }
      pcStack_28 = JavascriptString::GetString((JavascriptString *)computedNameVar);
      returnStr._4_4_ = JavascriptString::GetLength((JavascriptString *)computedNameVar);
    }
  }
  bVar2 = IsValidCharCount((ulong)returnStr._4_4_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x35c,"(IsValidCharCount(length))",
                                "JavascriptString can\'t be larger than charcount_t");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  computedName = JavascriptFunction::DisplayNameHelper
                           ((JavascriptFunction *)this,pcStack_28,returnStr._4_4_);
  LeavePinnedScope();
  return (JavascriptString *)(ScriptFunction *)computedName;
}

Assistant:

JavascriptString* ScriptFunction::GetDisplayNameImpl() const
    {
        Assert(this->GetFunctionProxy() != nullptr); // The caller should guarantee a proxy exists
        ParseableFunctionInfo * func = this->GetFunctionProxy()->EnsureDeserialized();
        const char16* name = nullptr;
        charcount_t length = 0;
        JavascriptString* returnStr = nullptr;
        ENTER_PINNED_SCOPE(JavascriptString, computedName);
        Var computedNameVar = this->GetComputedNameVar();
        if (computedNameVar != nullptr)
        {
            const char16* symbolName = nullptr;
            charcount_t symbolNameLength = 0;
            if (ScriptFunction::GetSymbolName(computedNameVar, &symbolName, &symbolNameLength))
            {
                if (symbolNameLength == 0)
                {
                    name = symbolName;
                }
                else
                {
                    name = FunctionProxy::WrapWithBrackets(symbolName, symbolNameLength, this->GetScriptContext());
                    length = symbolNameLength + 2; //adding 2 to length for  brackets
                }
            }
            else
            {
                computedName = ScriptFunction::GetComputedName(computedNameVar, this->GetScriptContext());
                if (!func->GetIsAccessor())
                {
                    return computedName;
                }
                name = computedName->GetString();
                length = computedName->GetLength();
            }
        }
        else
        {
            name = Constants::Empty;
            if (func->GetIsNamedFunctionExpression()) // GetIsNamedFunctionExpression -> ex. var a = function foo() {} where name is foo
            {
                name = func->GetShortDisplayName(&length);
            }
            else if (func->GetIsNameIdentifierRef()) // GetIsNameIdentifierRef        -> confirms a name is not attached like o.x = function() {}
            {
                if (this->GetScriptContext()->GetConfig()->IsES6FunctionNameFullEnabled())
                {
                    name = func->GetShortDisplayName(&length);
                }
                else if (func->GetIsDeclaration() || // GetIsDeclaration -> ex. function foo () {}
                         func->GetIsAccessor()    || // GetIsAccessor    -> ex. var a = { get f() {}} new enough syntax that we do not have to disable by default
                         func->IsLambda()         || // IsLambda         -> ex. var y = { o : () => {}}
                         GetHomeObj())               // GetHomeObj       -> ex. var o = class {}, confirms this is a constructor or method on a class
                {
                    name = func->GetShortDisplayName(&length);
                }
            }
        }
        AssertMsg(IsValidCharCount(length), "JavascriptString can't be larger than charcount_t");
        returnStr = DisplayNameHelper(name, static_cast<charcount_t>(length));

        LEAVE_PINNED_SCOPE();

        return returnStr;
    }